

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void check_source_state_int(SourceWrapper *src,ALenum param,ALint *current)

{
  ALint local_24;
  ALint *pAStack_20;
  ALint ival;
  ALint *current_local;
  SourceWrapper *pSStack_10;
  ALenum param_local;
  SourceWrapper *src_local;
  
  local_24 = 0;
  pAStack_20 = current;
  current_local._4_4_ = param;
  pSStack_10 = src;
  (*REAL_alGetSourcei)(src->name,param,&local_24);
  if (local_24 != *pAStack_20) {
    IO_EVENTENUM(ALEE_SOURCE_STATE_CHANGED_INT);
    IO_UINT32(pSStack_10->name);
    IO_ENUM(current_local._4_4_);
    IO_INT32(local_24);
    *pAStack_20 = local_24;
  }
  return;
}

Assistant:

static void check_source_state_int(SourceWrapper *src, const ALenum param, ALint *current)
{
    ALint ival = 0;
    REAL_alGetSourcei(src->name, param, &ival);
    if (ival != *current) {
        IO_EVENTENUM(ALEE_SOURCE_STATE_CHANGED_INT);
        IO_UINT32(src->name);
        IO_ENUM(param);
        IO_INT32(ival);
        *current = ival;
    }
}